

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_test.cpp
# Opt level: O1

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* read_pid_statm(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *__return_storage_ptr__,string *path)

{
  char **__nptr;
  char cVar1;
  int *piVar2;
  long lVar3;
  mapped_type *pmVar4;
  undefined8 uVar5;
  int iVar6;
  char **__endptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  info;
  string next_line;
  string line;
  ifstream fin;
  undefined1 auStack_2b8 [8];
  undefined1 local_2b0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268 [16];
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((string *)local_238);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)path);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_278 = local_268;
  local_270 = 0;
  local_268[0] = 0;
  while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
    cVar1 = std::ios::widen((char)auStack_2b8 + (char)*(long *)(local_238[0] + -0x18) + -0x80);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278,cVar1);
    std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278);
  }
  std::ifstream::close();
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"\\s+","");
  split(&local_290,&local_258,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_);
  }
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  __nptr = (char **)((local_290.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar6 = *piVar2;
  *piVar2 = 0;
  __endptr = (char **)local_2b0;
  lVar3 = strtol((char *)__nptr,__endptr,10);
  if ((char **)local_2b0._0_8_ == __nptr) {
    std::__throw_invalid_argument("stoi");
LAB_001079a6:
    std::__throw_out_of_range("stoi");
LAB_001079b2:
    std::__throw_invalid_argument("stoi");
LAB_001079be:
    std::__throw_out_of_range("stoi");
LAB_001079ca:
    std::__throw_invalid_argument("stoi");
LAB_001079d6:
    std::__throw_out_of_range("stoi");
LAB_001079e2:
    std::__throw_invalid_argument("stoi");
LAB_001079ee:
    std::__throw_out_of_range("stoi");
LAB_001079fa:
    std::__throw_invalid_argument("stoi");
LAB_00107a06:
    std::__throw_out_of_range("stoi");
LAB_00107a12:
    std::__throw_invalid_argument("stoi");
LAB_00107a1e:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((int)lVar3 != lVar3) goto LAB_001079a6;
    if (*piVar2 == 0x22) goto LAB_001079a6;
    if (*piVar2 == 0) {
      *piVar2 = iVar6;
    }
    iVar6 = PAGESIZE * (int)lVar3;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"vms","");
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)local_2b0);
    *pmVar4 = iVar6;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    __endptr = (char **)local_290.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    iVar6 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol((char *)__endptr,(char **)local_2b0,10);
    if ((char **)local_2b0._0_8_ == __endptr) goto LAB_001079b2;
    if ((lVar3 - 0x80000000U < 0xffffffff00000000) || (*piVar2 == 0x22)) goto LAB_001079be;
    if (*piVar2 == 0) {
      *piVar2 = iVar6;
    }
    iVar6 = (int)lVar3 * PAGESIZE;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"rss","");
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)local_2b0);
    *pmVar4 = iVar6;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    __endptr = (char **)local_290.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    iVar6 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol((char *)__endptr,(char **)local_2b0,10);
    if ((char **)local_2b0._0_8_ == __endptr) goto LAB_001079ca;
    if ((lVar3 - 0x80000000U < 0xffffffff00000000) || (*piVar2 == 0x22)) goto LAB_001079d6;
    if (*piVar2 == 0) {
      *piVar2 = iVar6;
    }
    iVar6 = (int)lVar3 * PAGESIZE;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"shared","");
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)local_2b0);
    *pmVar4 = iVar6;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    __endptr = (char **)local_290.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
    iVar6 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol((char *)__endptr,(char **)local_2b0,10);
    if ((char **)local_2b0._0_8_ == __endptr) goto LAB_001079e2;
    if ((lVar3 - 0x80000000U < 0xffffffff00000000) || (*piVar2 == 0x22)) goto LAB_001079ee;
    if (*piVar2 == 0) {
      *piVar2 = iVar6;
    }
    iVar6 = (int)lVar3 * PAGESIZE;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"text","");
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)local_2b0);
    *pmVar4 = iVar6;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    __endptr = (char **)local_290.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    iVar6 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol((char *)__endptr,(char **)local_2b0,10);
    if ((char **)local_2b0._0_8_ == __endptr) goto LAB_001079fa;
    if ((lVar3 - 0x80000000U < 0xffffffff00000000) || (*piVar2 == 0x22)) goto LAB_00107a06;
    if (*piVar2 == 0) {
      *piVar2 = iVar6;
    }
    iVar6 = (int)lVar3 * PAGESIZE;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"lib","");
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)local_2b0);
    *pmVar4 = iVar6;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    __endptr = (char **)local_290.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
    iVar6 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol((char *)__endptr,(char **)local_2b0,10);
    if ((char **)local_2b0._0_8_ == __endptr) goto LAB_00107a12;
    if ((lVar3 - 0x80000000U < 0xffffffff00000000) || (*piVar2 == 0x22)) goto LAB_00107a1e;
    if (*piVar2 == 0) {
      *piVar2 = iVar6;
    }
    iVar6 = (int)lVar3 * PAGESIZE;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"data","");
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)local_2b0);
    *pmVar4 = iVar6;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    __endptr = (char **)local_290.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
    iVar6 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol((char *)__endptr,(char **)local_2b0,10);
    if ((char **)local_2b0._0_8_ != __endptr) {
      if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar2 != 0x22)) {
        if (*piVar2 == 0) {
          *piVar2 = iVar6;
        }
        iVar6 = (int)lVar3 * PAGESIZE;
        local_2b0._0_8_ = local_2b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"dirty","");
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)__return_storage_ptr__,(key_type *)local_2b0);
        *pmVar4 = iVar6;
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_290);
        if (local_278 != local_268) {
          operator_delete(local_278);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        std::ifstream::~ifstream(local_238);
        return __return_storage_ptr__;
      }
      goto LAB_00107a36;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00107a36:
  uVar5 = std::__throw_out_of_range("stoi");
  if ((char **)local_2b0._0_8_ != __endptr) {
    operator_delete((void *)local_2b0._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&__return_storage_ptr__->_M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_290);
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar5);
}

Assistant:

std::unordered_map<std::string, int>
read_pid_statm(const std::string &path) {
    std::ifstream fin;
    fin.open(path);
    std::string line;
    std::string next_line;
    while (!fin.eof()) {
        getline(fin, next_line);
        line += next_line;
    }
    fin.close();

    std::vector<std::string> info = split(line, "\\s+");
    std::unordered_map<std::string, int> result_map;
    result_map["vms"] = stoi(info[0]) * PAGESIZE;
    result_map["rss"] = stoi(info[1]) * PAGESIZE;
    result_map["shared"] = stoi(info[2]) * PAGESIZE;
    result_map["text"] = stoi(info[3]) * PAGESIZE;
    result_map["lib"] = stoi(info[4]) * PAGESIZE;
    result_map["data"] = stoi(info[5]) * PAGESIZE;
    result_map["dirty"] = stoi(info[6]) * PAGESIZE;

    return result_map;
}